

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O1

void Fxu_HeapSingleUpdate(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single **ppFVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Fxu_Single *pFVar5;
  uint uVar6;
  int iVar7;
  Fxu_Single **ppFVar8;
  Fxu_Single **ppFVar9;
  Fxu_Single *pFVar10;
  
  uVar6 = pSingle->HNum;
  if (((int)uVar6 < 1) || (p->nItemsAlloc < (int)uVar6)) {
    __assert_fail("(pSingle)->HNum >= 1 && (pSingle)->HNum <= p->nItemsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxu/fxuHeapS.c"
                  ,0xe4,"void Fxu_HeapSingleUpdate(Fxu_HeapSingle *, Fxu_Single *)");
  }
  if ((uVar6 != 1) && (p->pTree[uVar6 >> 1]->Weight < pSingle->Weight)) {
    pFVar5 = p->pTree[pSingle->HNum];
    if (1 < pFVar5->HNum) {
      iVar3 = pFVar5->Weight;
      ppFVar8 = p->pTree + pSingle->HNum;
      uVar6 = pFVar5->HNum;
      do {
        pFVar10 = p->pTree[uVar6 >> 1];
        if (iVar3 <= pFVar10->Weight) {
          return;
        }
        ppFVar9 = p->pTree + (uVar6 >> 1);
        *ppFVar8 = pFVar10;
        *ppFVar9 = pFVar5;
        uVar2 = (*ppFVar8)->HNum;
        (*ppFVar8)->HNum = uVar6;
        pFVar5->HNum = uVar2;
        ppFVar8 = ppFVar9;
        uVar6 = uVar2;
      } while (1 < (int)uVar2);
    }
    return;
  }
  uVar6 = uVar6 * 2;
  if (((p->nItems < (int)uVar6) || (p->pTree[(int)uVar6]->Weight <= pSingle->Weight)) &&
     ((p->nItems <= (int)uVar6 || (p->pTree[(int)(uVar6 | 1)]->Weight <= pSingle->Weight)))) {
    return;
  }
  iVar3 = p->nItems;
  pFVar5 = p->pTree[pSingle->HNum];
  uVar6 = pFVar5->HNum * 2;
  if ((int)uVar6 <= iVar3) {
    ppFVar8 = p->pTree + pSingle->HNum;
    iVar7 = pFVar5->HNum;
    do {
      ppFVar9 = p->pTree + (int)uVar6;
      if ((int)uVar6 < iVar3) {
        ppFVar1 = p->pTree + (int)(uVar6 | 1);
        iVar4 = (*ppFVar9)->Weight;
        if ((iVar4 <= pFVar5->Weight) && ((*ppFVar1)->Weight <= pFVar5->Weight)) {
          return;
        }
        pFVar10 = *ppFVar9;
        if (iVar4 < (*ppFVar1)->Weight) {
          ppFVar9 = ppFVar1;
          pFVar10 = *ppFVar1;
        }
      }
      else {
        pFVar10 = *ppFVar9;
        if ((*ppFVar9)->Weight <= pFVar5->Weight) {
          return;
        }
      }
      *ppFVar8 = pFVar10;
      *ppFVar9 = pFVar5;
      iVar4 = (*ppFVar8)->HNum;
      (*ppFVar8)->HNum = iVar7;
      pFVar5->HNum = iVar4;
      uVar6 = iVar4 * 2;
      ppFVar8 = ppFVar9;
      iVar7 = iVar4;
    } while ((int)uVar6 <= iVar3);
  }
  return;
}

Assistant:

void Fxu_HeapSingleUpdate( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    FXU_HEAP_SINGLE_ASSERT(p,pSingle);
    if ( FXU_HEAP_SINGLE_PARENT_EXISTS(p,pSingle) && 
         FXU_HEAP_SINGLE_WEIGHT(pSingle) > FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_PARENT(p,pSingle) ) )
        Fxu_HeapSingleMoveUp( p, pSingle );
    else if ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,pSingle) && 
        FXU_HEAP_SINGLE_WEIGHT(pSingle) < FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD1(p,pSingle) ) )
        Fxu_HeapSingleMoveDn( p, pSingle );
    else if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,pSingle) && 
        FXU_HEAP_SINGLE_WEIGHT(pSingle) < FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD2(p,pSingle) ) )
        Fxu_HeapSingleMoveDn( p, pSingle );
}